

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O0

__m128i convolve_lo_x_12tap(__m128i *s,__m128i *coeffs,__m128i zero)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  undefined1 in_XMM0_Ba;
  undefined1 in_XMM0_Bb;
  undefined1 in_XMM0_Bc;
  undefined1 in_XMM0_Bd;
  __m128i alVar2;
  __m128i ss [6];
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  
  uVar1 = *in_RDI;
  local_58 = (undefined1)uVar1;
  uStack_57 = (undefined1)((ulong)uVar1 >> 8);
  uStack_56 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_55 = (undefined1)((ulong)uVar1 >> 0x18);
  alVar2 = convolve_12tap((__m128i *)
                          CONCAT17(in_XMM0_Bd,
                                   CONCAT16(uStack_55,
                                            CONCAT15(in_XMM0_Bc,
                                                     CONCAT14(uStack_56,
                                                              CONCAT13(in_XMM0_Bb,
                                                                       CONCAT12(uStack_57,
                                                                                CONCAT11(in_XMM0_Ba,
                                                                                         local_58)))
                                                             )))),(__m128i *)0x72561c);
  alVar2[0] = alVar2[0];
  alVar2[1] = alVar2[1];
  return alVar2;
}

Assistant:

static inline __m128i convolve_lo_x_12tap(const __m128i *s,
                                          const __m128i *coeffs,
                                          const __m128i zero) {
  __m128i ss[6];
  ss[0] = _mm_unpacklo_epi8(s[0], zero);  //  0  1  1  2  2  3  3  4
  ss[1] = _mm_unpacklo_epi8(s[1], zero);  //  2  3  3  4  4  5  5  6
  ss[2] = _mm_unpacklo_epi8(s[2], zero);  //  4  5  5  6  6  7  7  8
  ss[3] = _mm_unpacklo_epi8(s[3], zero);  //  6  7  7  8  8  9  9 10
  ss[4] = _mm_unpackhi_epi8(s[2], zero);  //  8  9  9 10 10 11 11 12
  ss[5] = _mm_unpackhi_epi8(s[3], zero);  // 10 11 11 12 12 13 13 14
  return convolve_12tap(ss, coeffs);
}